

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::Message(Parser *this,string *msg)

{
  string *psVar1;
  int64_t t;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  psVar1 = &this->error_;
  if ((this->error_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
  }
  if ((this->file_being_parsed_)._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  }
  else {
    AbsolutePath(&local_a0,&this->file_being_parsed_);
  }
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((this->file_being_parsed_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
  }
  NumToString<int>(&local_40,(this->super_ParserState).line_);
  std::operator+(&local_60,&local_40,": ");
  t = ParserState::CursorPosition(&this->super_ParserState);
  NumToString<long>(&local_80,t);
  std::operator+(&local_a0,&local_60,&local_80);
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_a0,": ",msg);
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void Parser::Message(const std::string &msg) {
  if (!error_.empty()) error_ += "\n";  // log all warnings and errors
  error_ += file_being_parsed_.length() ? AbsolutePath(file_being_parsed_) : "";
  // clang-format off

  #ifdef _WIN32  // MSVC alike
    error_ +=
        "(" + NumToString(line_) + ", " + NumToString(CursorPosition()) + ")";
  #else  // gcc alike
    if (file_being_parsed_.length()) error_ += ":";
    error_ += NumToString(line_) + ": " + NumToString(CursorPosition());
  #endif
  // clang-format on
  error_ += ": " + msg;
}